

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 uVar9;
  uint uVar10;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  Scene *pSVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  int iVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  byte bVar36;
  ulong uVar37;
  long lVar38;
  uint uVar39;
  uint uVar40;
  ulong unaff_RBX;
  size_t mask;
  ulong *puVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [32];
  undefined1 in_ZMM15 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  RTCFilterFunctionNArguments args;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_2870;
  undefined8 uStack_2868;
  ulong *local_2858;
  ulong local_2850;
  ulong local_2848;
  long local_2840;
  ulong local_2838;
  ulong local_2830;
  ulong local_2828;
  ulong local_2820;
  long local_2818;
  RTCFilterFunctionNArguments local_2810;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2710 [16];
  undefined1 local_2700 [32];
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  RTCHitN local_26b0 [16];
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  undefined1 local_2680 [16];
  undefined4 local_2670;
  undefined4 uStack_266c;
  undefined4 uStack_2668;
  undefined4 uStack_2664;
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  uint local_2640;
  uint uStack_263c;
  uint uStack_2638;
  uint uStack_2634;
  uint uStack_2630;
  uint uStack_262c;
  uint uStack_2628;
  uint uStack_2624;
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  uint uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  float fVar2;
  float fVar3;
  float fVar4;
  
  puVar41 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  local_2740 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar84 = ZEXT3264(local_2740);
  local_2760 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar85 = ZEXT3264(local_2760);
  local_2780 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar86 = ZEXT3264(local_2780);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_27a0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 0.99999964)));
  auVar87 = ZEXT3264(local_27a0);
  local_27c0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar7 * 0.99999964)));
  auVar88 = ZEXT3264(local_27c0);
  local_27e0 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar8 * 0.99999964)));
  auVar89 = ZEXT3264(local_27e0);
  fVar6 = fVar6 * 1.0000004;
  local_25c0._4_4_ = fVar6;
  local_25c0._0_4_ = fVar6;
  local_25c0._8_4_ = fVar6;
  local_25c0._12_4_ = fVar6;
  local_25c0._16_4_ = fVar6;
  local_25c0._20_4_ = fVar6;
  local_25c0._24_4_ = fVar6;
  local_25c0._28_4_ = fVar6;
  auVar76 = ZEXT3264(local_25c0);
  fVar7 = fVar7 * 1.0000004;
  local_25e0._4_4_ = fVar7;
  local_25e0._0_4_ = fVar7;
  local_25e0._8_4_ = fVar7;
  local_25e0._12_4_ = fVar7;
  local_25e0._16_4_ = fVar7;
  local_25e0._20_4_ = fVar7;
  local_25e0._24_4_ = fVar7;
  local_25e0._28_4_ = fVar7;
  auVar77 = ZEXT3264(local_25e0);
  fVar8 = fVar8 * 1.0000004;
  local_2600._4_4_ = fVar8;
  local_2600._0_4_ = fVar8;
  local_2600._8_4_ = fVar8;
  local_2600._12_4_ = fVar8;
  local_2600._16_4_ = fVar8;
  local_2600._20_4_ = fVar8;
  local_2600._24_4_ = fVar8;
  local_2600._28_4_ = fVar8;
  auVar79 = ZEXT3264(local_2600);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar43 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2820 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2828 = uVar42 ^ 0x20;
  local_2830 = uVar43 ^ 0x20;
  local_2838 = local_2820 ^ 0x20;
  iVar34 = (tray->tnear).field_0.i[k];
  local_2620._4_4_ = iVar34;
  local_2620._0_4_ = iVar34;
  local_2620._8_4_ = iVar34;
  local_2620._12_4_ = iVar34;
  local_2620._16_4_ = iVar34;
  local_2620._20_4_ = iVar34;
  local_2620._24_4_ = iVar34;
  local_2620._28_4_ = iVar34;
  auVar80 = ZEXT3264(local_2620);
  iVar34 = (tray->tfar).field_0.i[k];
  auVar69 = ZEXT3264(CONCAT428(iVar34,CONCAT424(iVar34,CONCAT420(iVar34,CONCAT416(iVar34,CONCAT412(
                                                  iVar34,CONCAT48(iVar34,CONCAT44(iVar34,iVar34)))))
                                               )));
  local_2710 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar67 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar81 = ZEXT3264(auVar67);
  auVar82 = ZEXT3264(CONCAT428(0xfffffff8,
                               CONCAT424(0xfffffff8,
                                         CONCAT420(0xfffffff8,
                                                   CONCAT416(0xfffffff8,
                                                             CONCAT412(0xfffffff8,
                                                                       CONCAT48(0xfffffff8,
                                                                                0xfffffff8fffffff8))
                                                            )))));
  do {
    do {
      do {
        if (puVar41 == &local_23a0) {
          return;
        }
        pfVar5 = (float *)(puVar41 + -1);
        puVar41 = puVar41 + -2;
      } while (*(float *)(ray + k * 4 + 0x80) < *pfVar5);
      uVar44 = *puVar41;
      do {
        auVar67 = auVar80._0_32_;
        if ((uVar44 & 8) == 0) {
          auVar45 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar44 + 0x40 + uVar42),auVar84._0_32_);
          auVar45 = vmulps_avx512vl(auVar87._0_32_,auVar45);
          auVar46 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar44 + 0x40 + uVar43),auVar85._0_32_);
          auVar46 = vmulps_avx512vl(auVar88._0_32_,auVar46);
          auVar45 = vmaxps_avx(auVar45,auVar46);
          auVar46 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar44 + 0x40 + local_2820),
                                    auVar86._0_32_);
          auVar46 = vmulps_avx512vl(auVar89._0_32_,auVar46);
          auVar46 = vmaxps_avx(auVar46,auVar67);
          auVar45 = vmaxps_avx(auVar45,auVar46);
          in_ZMM15 = ZEXT3264(auVar45);
          auVar47 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar44 + 0x40 + local_2828),
                                    auVar84._0_32_);
          auVar46._4_4_ = auVar76._4_4_ * auVar47._4_4_;
          auVar46._0_4_ = auVar76._0_4_ * auVar47._0_4_;
          auVar46._8_4_ = auVar76._8_4_ * auVar47._8_4_;
          auVar46._12_4_ = auVar76._12_4_ * auVar47._12_4_;
          auVar46._16_4_ = auVar76._16_4_ * auVar47._16_4_;
          auVar46._20_4_ = auVar76._20_4_ * auVar47._20_4_;
          auVar46._24_4_ = auVar76._24_4_ * auVar47._24_4_;
          auVar46._28_4_ = auVar47._28_4_;
          auVar48 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar44 + 0x40 + local_2830),
                                    auVar85._0_32_);
          auVar47._4_4_ = auVar77._4_4_ * auVar48._4_4_;
          auVar47._0_4_ = auVar77._0_4_ * auVar48._0_4_;
          auVar47._8_4_ = auVar77._8_4_ * auVar48._8_4_;
          auVar47._12_4_ = auVar77._12_4_ * auVar48._12_4_;
          auVar47._16_4_ = auVar77._16_4_ * auVar48._16_4_;
          auVar47._20_4_ = auVar77._20_4_ * auVar48._20_4_;
          auVar47._24_4_ = auVar77._24_4_ * auVar48._24_4_;
          auVar47._28_4_ = auVar48._28_4_;
          auVar46 = vminps_avx(auVar46,auVar47);
          auVar47 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar44 + 0x40 + local_2838),
                                    auVar86._0_32_);
          auVar48._4_4_ = auVar79._4_4_ * auVar47._4_4_;
          auVar48._0_4_ = auVar79._0_4_ * auVar47._0_4_;
          auVar48._8_4_ = auVar79._8_4_ * auVar47._8_4_;
          auVar48._12_4_ = auVar79._12_4_ * auVar47._12_4_;
          auVar48._16_4_ = auVar79._16_4_ * auVar47._16_4_;
          auVar48._20_4_ = auVar79._20_4_ * auVar47._20_4_;
          auVar48._24_4_ = auVar79._24_4_ * auVar47._24_4_;
          auVar48._28_4_ = auVar47._28_4_;
          auVar47 = vminps_avx(auVar48,auVar69._0_32_);
          auVar46 = vminps_avx(auVar46,auVar47);
          uVar19 = vcmpps_avx512vl(auVar45,auVar46,2);
          unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),(uint)(byte)uVar19);
        }
        if ((uVar44 & 8) == 0) {
          if (unaff_RBX == 0) {
            iVar34 = 4;
          }
          else {
            auVar45 = *(undefined1 (*) [32])(uVar44 & 0xfffffffffffffff0);
            auVar46 = ((undefined1 (*) [32])(uVar44 & 0xfffffffffffffff0))[1];
            auVar50 = auVar81._0_32_;
            auVar51 = auVar82._0_32_;
            auVar52 = in_ZMM15._0_32_;
            auVar47 = vpternlogd_avx512vl(auVar50,auVar52,auVar51,0xf8);
            uVar44 = unaff_RBX & 0xffffffff;
            auVar48 = vpcompressd_avx512vl(auVar47);
            bVar18 = (bool)((byte)uVar44 & 1);
            auVar49._0_4_ = (uint)bVar18 * auVar48._0_4_ | (uint)!bVar18 * auVar47._0_4_;
            bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
            auVar49._4_4_ = (uint)bVar18 * auVar48._4_4_ | (uint)!bVar18 * auVar47._4_4_;
            bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
            auVar49._8_4_ = (uint)bVar18 * auVar48._8_4_ | (uint)!bVar18 * auVar47._8_4_;
            bVar18 = (bool)((byte)(uVar44 >> 3) & 1);
            auVar49._12_4_ = (uint)bVar18 * auVar48._12_4_ | (uint)!bVar18 * auVar47._12_4_;
            bVar18 = (bool)((byte)(uVar44 >> 4) & 1);
            auVar49._16_4_ = (uint)bVar18 * auVar48._16_4_ | (uint)!bVar18 * auVar47._16_4_;
            bVar18 = (bool)((byte)(uVar44 >> 5) & 1);
            auVar49._20_4_ = (uint)bVar18 * auVar48._20_4_ | (uint)!bVar18 * auVar47._20_4_;
            bVar18 = (bool)((byte)(uVar44 >> 6) & 1);
            auVar49._24_4_ = (uint)bVar18 * auVar48._24_4_ | (uint)!bVar18 * auVar47._24_4_;
            bVar18 = (bool)((byte)(uVar44 >> 7) & 1);
            auVar49._28_4_ = (uint)bVar18 * auVar48._28_4_ | (uint)!bVar18 * auVar47._28_4_;
            auVar47 = vpermt2q_avx512vl(auVar45,auVar49,auVar46);
            uVar44 = auVar47._0_8_;
            iVar33 = 0;
            uVar37 = unaff_RBX - 1 & unaff_RBX;
            iVar34 = 0;
            if (uVar37 != 0) {
              auVar47 = vpshufd_avx2(auVar49,0x55);
              vpermt2q_avx512vl(auVar45,auVar47,auVar46);
              auVar48 = vpminsd_avx2(auVar49,auVar47);
              auVar47 = vpmaxsd_avx2(auVar49,auVar47);
              uVar37 = uVar37 - 1 & uVar37;
              if (uVar37 == 0) {
                auVar67 = vpermi2q_avx512vl(auVar48,auVar45,auVar46);
                uVar44 = auVar67._0_8_;
                auVar67 = vpermt2q_avx512vl(auVar45,auVar47,auVar46);
                *puVar41 = auVar67._0_8_;
                auVar67 = vpermd_avx2(auVar47,auVar52);
                *(int *)(puVar41 + 1) = auVar67._0_4_;
                puVar41 = puVar41 + 2;
              }
              else {
                auVar62 = vpshufd_avx2(auVar49,0xaa);
                vpermt2q_avx512vl(auVar45,auVar62,auVar46);
                auVar53 = vpminsd_avx2(auVar48,auVar62);
                auVar48 = vpmaxsd_avx2(auVar48,auVar62);
                auVar62 = vpminsd_avx2(auVar47,auVar48);
                auVar47 = vpmaxsd_avx2(auVar47,auVar48);
                uVar37 = uVar37 - 1 & uVar37;
                iVar34 = iVar33;
                if (uVar37 == 0) {
                  auVar67 = vpermi2q_avx512vl(auVar53,auVar45,auVar46);
                  uVar44 = auVar67._0_8_;
                  auVar67 = vpermt2q_avx512vl(auVar45,auVar47,auVar46);
                  *puVar41 = auVar67._0_8_;
                  auVar67 = vpermd_avx2(auVar47,auVar52);
                  *(int *)(puVar41 + 1) = auVar67._0_4_;
                  auVar67 = vpermt2q_avx512vl(auVar45,auVar62,auVar46);
                  puVar41[2] = auVar67._0_8_;
                  auVar67 = vpermd_avx2(auVar62,auVar52);
                  *(int *)(puVar41 + 3) = auVar67._0_4_;
                  puVar41 = puVar41 + 4;
                }
                else {
                  auVar64 = vmovdqa64_avx512vl(auVar52);
                  auVar48 = vpshufd_avx2(auVar49,0xff);
                  vpermt2q_avx512vl(auVar45,auVar48,auVar46);
                  auVar52 = vpminsd_avx2(auVar53,auVar48);
                  auVar48 = vpmaxsd_avx2(auVar53,auVar48);
                  auVar53 = vpminsd_avx2(auVar62,auVar48);
                  auVar48 = vpmaxsd_avx2(auVar62,auVar48);
                  auVar62 = vpminsd_avx2(auVar47,auVar48);
                  auVar47 = vpmaxsd_avx2(auVar47,auVar48);
                  uVar37 = uVar37 - 1 & uVar37;
                  if (uVar37 == 0) {
                    auVar48 = vpermi2q_avx512vl(auVar52,auVar45,auVar46);
                    uVar44 = auVar48._0_8_;
                    auVar48 = vpermt2q_avx512vl(auVar45,auVar47,auVar46);
                    *puVar41 = auVar48._0_8_;
                    auVar48 = vmovdqa64_avx512vl(auVar64);
                    in_ZMM15 = ZEXT3264(auVar48);
                    auVar47 = vpermd_avx512vl(auVar47,auVar64);
                    *(int *)(puVar41 + 1) = auVar47._0_4_;
                    auVar47 = vpermt2q_avx512vl(auVar45,auVar62,auVar46);
                    puVar41[2] = auVar47._0_8_;
                    auVar47 = vpermd_avx512vl(auVar62,auVar64);
                    *(int *)(puVar41 + 3) = auVar47._0_4_;
                    auVar45 = vpermt2q_avx512vl(auVar45,auVar53,auVar46);
                    puVar41[4] = auVar45._0_8_;
                    auVar45 = vpermd_avx512vl(auVar53,auVar64);
                    *(int *)(puVar41 + 5) = auVar45._0_4_;
                    puVar41 = puVar41 + 6;
                    auVar84 = ZEXT3264(local_2740);
                    auVar85 = ZEXT3264(local_2760);
                    auVar86 = ZEXT3264(local_2780);
                    auVar87 = ZEXT3264(local_27a0);
                    auVar88 = ZEXT3264(local_27c0);
                    auVar89 = ZEXT3264(local_27e0);
                    auVar76 = ZEXT3264(auVar76._0_32_);
                    auVar77 = ZEXT3264(auVar77._0_32_);
                    auVar79 = ZEXT3264(auVar79._0_32_);
                    auVar80 = ZEXT3264(auVar67);
                    auVar81 = ZEXT3264(auVar50);
                    auVar82 = ZEXT3264(auVar51);
                  }
                  else {
                    auVar63 = valignd_avx512vl(auVar49,auVar49,3);
                    auVar48 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                    auVar49 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                   CONCAT48(0x80000000,
                                                                            0x8000000080000000))),
                                                auVar48,auVar52);
                    auVar48 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                    auVar49 = vpermt2d_avx512vl(auVar49,auVar48,auVar53);
                    auVar49 = vpermt2d_avx512vl(auVar49,auVar48,auVar62);
                    auVar48 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                    auVar47 = vpermt2d_avx512vl(auVar49,auVar48,auVar47);
                    auVar80 = ZEXT3264(auVar47);
                    uVar44 = uVar37;
                    do {
                      auVar48 = auVar80._0_32_;
                      auVar53._8_4_ = 1;
                      auVar53._0_8_ = 0x100000001;
                      auVar53._12_4_ = 1;
                      auVar53._16_4_ = 1;
                      auVar53._20_4_ = 1;
                      auVar53._24_4_ = 1;
                      auVar53._28_4_ = 1;
                      auVar47 = vpermd_avx2(auVar53,auVar63);
                      auVar63 = valignd_avx512vl(auVar63,auVar63,1);
                      vpermt2q_avx512vl(auVar45,auVar63,auVar46);
                      uVar44 = uVar44 - 1 & uVar44;
                      uVar19 = vpcmpd_avx512vl(auVar47,auVar48,5);
                      auVar47 = vpmaxsd_avx2(auVar47,auVar48);
                      bVar36 = (byte)uVar19 << 1;
                      auVar48 = valignd_avx512vl(auVar48,auVar48,7);
                      bVar18 = (bool)((byte)uVar19 & 1);
                      auVar52._4_4_ = (uint)bVar18 * auVar48._4_4_ | (uint)!bVar18 * auVar47._4_4_;
                      auVar52._0_4_ = auVar47._0_4_;
                      bVar18 = (bool)(bVar36 >> 2 & 1);
                      auVar52._8_4_ = (uint)bVar18 * auVar48._8_4_ | (uint)!bVar18 * auVar47._8_4_;
                      bVar18 = (bool)(bVar36 >> 3 & 1);
                      auVar52._12_4_ =
                           (uint)bVar18 * auVar48._12_4_ | (uint)!bVar18 * auVar47._12_4_;
                      bVar18 = (bool)(bVar36 >> 4 & 1);
                      auVar52._16_4_ =
                           (uint)bVar18 * auVar48._16_4_ | (uint)!bVar18 * auVar47._16_4_;
                      bVar18 = (bool)(bVar36 >> 5 & 1);
                      auVar52._20_4_ =
                           (uint)bVar18 * auVar48._20_4_ | (uint)!bVar18 * auVar47._20_4_;
                      bVar18 = (bool)(bVar36 >> 6 & 1);
                      auVar52._24_4_ =
                           (uint)bVar18 * auVar48._24_4_ | (uint)!bVar18 * auVar47._24_4_;
                      auVar52._28_4_ =
                           (uint)(bVar36 >> 7) * auVar48._28_4_ |
                           (uint)!(bool)(bVar36 >> 7) * auVar47._28_4_;
                      auVar80 = ZEXT3264(auVar52);
                    } while (uVar44 != 0);
                    lVar38 = POPCOUNT(uVar37) + 3;
                    do {
                      auVar47 = vpermi2q_avx512vl(auVar52,auVar45,auVar46);
                      *puVar41 = auVar47._0_8_;
                      auVar48 = auVar80._0_32_;
                      auVar47 = vpermd_avx512vl(auVar48,auVar64);
                      *(int *)(puVar41 + 1) = auVar47._0_4_;
                      auVar52 = valignd_avx512vl(auVar48,auVar48,1);
                      puVar41 = puVar41 + 2;
                      auVar80 = ZEXT3264(auVar52);
                      lVar38 = lVar38 + -1;
                    } while (lVar38 != 0);
                    auVar45 = vpermt2q_avx512vl(auVar45,auVar52,auVar46);
                    uVar44 = auVar45._0_8_;
                    auVar84 = ZEXT3264(local_2740);
                    auVar85 = ZEXT3264(local_2760);
                    auVar86 = ZEXT3264(local_2780);
                    auVar87 = ZEXT3264(local_27a0);
                    auVar88 = ZEXT3264(local_27c0);
                    auVar89 = ZEXT3264(local_27e0);
                    auVar76 = ZEXT3264(auVar76._0_32_);
                    auVar77 = ZEXT3264(auVar77._0_32_);
                    auVar79 = ZEXT3264(auVar79._0_32_);
                    auVar80 = ZEXT3264(auVar67);
                    auVar81 = ZEXT3264(auVar50);
                    auVar82 = ZEXT3264(auVar51);
                    auVar67 = vmovdqa64_avx512vl(auVar64);
                    in_ZMM15 = ZEXT3264(auVar67);
                  }
                }
              }
            }
          }
        }
        else {
          iVar34 = 6;
        }
      } while (iVar34 == 0);
    } while (iVar34 != 6);
    local_25a0 = in_ZMM15._0_32_;
    local_2840 = (ulong)((uint)uVar44 & 0xf) - 8;
    if (local_2840 != 0) {
      uVar44 = uVar44 & 0xfffffffffffffff0;
      local_2818 = 0;
      local_2850 = uVar44;
      local_2848 = unaff_RBX;
      do {
        lVar35 = local_2818 * 0xe0;
        lVar38 = uVar44 + 0xd0 + lVar35;
        local_26e0 = *(undefined8 *)(lVar38 + 0x10);
        uStack_26d8 = *(undefined8 *)(lVar38 + 0x18);
        lVar38 = uVar44 + 0xc0 + lVar35;
        local_2580 = *(undefined8 *)(lVar38 + 0x10);
        uStack_2578 = *(undefined8 *)(lVar38 + 0x18);
        uStack_2570 = local_2580;
        uStack_2568 = uStack_2578;
        uStack_26d0 = local_26e0;
        uStack_26c8 = uStack_26d8;
        auVar67._16_16_ = *(undefined1 (*) [16])(uVar44 + 0x60 + lVar35);
        auVar67._0_16_ = *(undefined1 (*) [16])(uVar44 + lVar35);
        auVar54._16_16_ = *(undefined1 (*) [16])(uVar44 + 0x70 + lVar35);
        auVar54._0_16_ = *(undefined1 (*) [16])(uVar44 + 0x10 + lVar35);
        auVar55._16_16_ = *(undefined1 (*) [16])(uVar44 + 0x80 + lVar35);
        auVar55._0_16_ = *(undefined1 (*) [16])(uVar44 + 0x20 + lVar35);
        auVar12 = *(undefined1 (*) [16])(uVar44 + 0x30 + lVar35);
        auVar56._16_16_ = auVar12;
        auVar56._0_16_ = auVar12;
        auVar12 = *(undefined1 (*) [16])(uVar44 + 0x40 + lVar35);
        auVar57._16_16_ = auVar12;
        auVar57._0_16_ = auVar12;
        auVar12 = *(undefined1 (*) [16])(uVar44 + 0x50 + lVar35);
        auVar58._16_16_ = auVar12;
        auVar58._0_16_ = auVar12;
        auVar12 = *(undefined1 (*) [16])(uVar44 + 0x90 + lVar35);
        auVar59._16_16_ = auVar12;
        auVar59._0_16_ = auVar12;
        auVar12 = *(undefined1 (*) [16])(uVar44 + 0xa0 + lVar35);
        auVar60._16_16_ = auVar12;
        auVar60._0_16_ = auVar12;
        auVar12 = *(undefined1 (*) [16])(uVar44 + 0xb0 + lVar35);
        auVar61._16_16_ = auVar12;
        auVar61._0_16_ = auVar12;
        uVar9 = *(undefined4 *)(ray + k * 4);
        auVar83._4_4_ = uVar9;
        auVar83._0_4_ = uVar9;
        auVar83._8_4_ = uVar9;
        auVar83._12_4_ = uVar9;
        auVar83._16_4_ = uVar9;
        auVar83._20_4_ = uVar9;
        auVar83._24_4_ = uVar9;
        auVar83._28_4_ = uVar9;
        auVar45 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
        auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
        uVar9 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar71._4_4_ = uVar9;
        auVar71._0_4_ = uVar9;
        auVar71._8_4_ = uVar9;
        auVar71._12_4_ = uVar9;
        auVar71._16_4_ = uVar9;
        auVar71._20_4_ = uVar9;
        auVar71._24_4_ = uVar9;
        auVar71._28_4_ = uVar9;
        uVar9 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar73._4_4_ = uVar9;
        auVar73._0_4_ = uVar9;
        auVar73._8_4_ = uVar9;
        auVar73._12_4_ = uVar9;
        auVar73._16_4_ = uVar9;
        auVar73._20_4_ = uVar9;
        auVar73._24_4_ = uVar9;
        auVar73._28_4_ = uVar9;
        fVar6 = *(float *)(ray + k * 4 + 0x60);
        auVar78._4_4_ = fVar6;
        auVar78._0_4_ = fVar6;
        auVar78._8_4_ = fVar6;
        auVar78._12_4_ = fVar6;
        auVar78._16_4_ = fVar6;
        auVar78._20_4_ = fVar6;
        auVar78._24_4_ = fVar6;
        auVar78._28_4_ = fVar6;
        auVar67 = vsubps_avx(auVar67,auVar83);
        auVar47 = vsubps_avx512vl(auVar54,auVar45);
        auVar48 = vsubps_avx512vl(auVar55,auVar46);
        auVar49 = vsubps_avx512vl(auVar56,auVar83);
        auVar50 = vsubps_avx512vl(auVar57,auVar45);
        auVar51 = vsubps_avx512vl(auVar58,auVar46);
        auVar52 = vsubps_avx512vl(auVar59,auVar83);
        auVar53 = vsubps_avx512vl(auVar60,auVar45);
        auVar46 = vsubps_avx512vl(auVar61,auVar46);
        auVar54 = vsubps_avx512vl(auVar52,auVar67);
        auVar55 = vsubps_avx512vl(auVar53,auVar47);
        auVar45 = vsubps_avx(auVar46,auVar48);
        auVar56 = vsubps_avx512vl(auVar67,auVar49);
        auVar57 = vsubps_avx512vl(auVar47,auVar50);
        auVar58 = vsubps_avx512vl(auVar48,auVar51);
        auVar59 = vsubps_avx512vl(auVar49,auVar52);
        auVar60 = vsubps_avx512vl(auVar50,auVar53);
        auVar61 = vsubps_avx512vl(auVar51,auVar46);
        auVar62 = vaddps_avx512vl(auVar52,auVar67);
        auVar63 = vaddps_avx512vl(auVar53,auVar47);
        auVar64 = vaddps_avx512vl(auVar46,auVar48);
        auVar65 = vmulps_avx512vl(auVar63,auVar45);
        auVar65 = vfmsub231ps_avx512vl(auVar65,auVar55,auVar64);
        auVar64 = vmulps_avx512vl(auVar64,auVar54);
        auVar66 = vfmsub231ps_avx512vl(auVar64,auVar45,auVar62);
        auVar64._4_4_ = auVar55._4_4_ * auVar62._4_4_;
        auVar64._0_4_ = auVar55._0_4_ * auVar62._0_4_;
        auVar64._8_4_ = auVar55._8_4_ * auVar62._8_4_;
        auVar64._12_4_ = auVar55._12_4_ * auVar62._12_4_;
        auVar64._16_4_ = auVar55._16_4_ * auVar62._16_4_;
        auVar64._20_4_ = auVar55._20_4_ * auVar62._20_4_;
        auVar64._24_4_ = auVar55._24_4_ * auVar62._24_4_;
        auVar64._28_4_ = auVar62._28_4_;
        auVar12 = vfmsub231ps_fma(auVar64,auVar54,auVar63);
        auVar70._0_4_ = fVar6 * auVar12._0_4_;
        auVar70._4_4_ = fVar6 * auVar12._4_4_;
        auVar70._8_4_ = fVar6 * auVar12._8_4_;
        auVar70._12_4_ = fVar6 * auVar12._12_4_;
        auVar70._16_4_ = fVar6 * 0.0;
        auVar70._20_4_ = fVar6 * 0.0;
        auVar70._24_4_ = fVar6 * 0.0;
        auVar70._28_4_ = 0;
        auVar62 = vfmadd231ps_avx512vl(auVar70,auVar73,auVar66);
        local_2560 = vfmadd231ps_avx512vl(auVar62,auVar71,auVar65);
        auVar62 = vaddps_avx512vl(auVar67,auVar49);
        auVar64 = vaddps_avx512vl(auVar47,auVar50);
        auVar63 = vaddps_avx512vl(auVar48,auVar51);
        auVar65 = vmulps_avx512vl(auVar64,auVar58);
        auVar65 = vfmsub231ps_avx512vl(auVar65,auVar57,auVar63);
        auVar63 = vmulps_avx512vl(auVar63,auVar56);
        auVar66 = vfmsub231ps_avx512vl(auVar63,auVar58,auVar62);
        auVar62 = vmulps_avx512vl(auVar62,auVar57);
        auVar62 = vfmsub231ps_avx512vl(auVar62,auVar56,auVar64);
        auVar63._4_4_ = auVar62._4_4_ * fVar6;
        auVar63._0_4_ = auVar62._0_4_ * fVar6;
        auVar63._8_4_ = auVar62._8_4_ * fVar6;
        auVar63._12_4_ = auVar62._12_4_ * fVar6;
        auVar63._16_4_ = auVar62._16_4_ * fVar6;
        auVar63._20_4_ = auVar62._20_4_ * fVar6;
        auVar63._24_4_ = auVar62._24_4_ * fVar6;
        auVar63._28_4_ = auVar62._28_4_;
        auVar62 = vfmadd231ps_avx512vl(auVar63,auVar73,auVar66);
        local_2540 = vfmadd231ps_avx512vl(auVar62,auVar71,auVar65);
        auVar49 = vaddps_avx512vl(auVar49,auVar52);
        auVar50 = vaddps_avx512vl(auVar50,auVar53);
        auVar46 = vaddps_avx512vl(auVar51,auVar46);
        auVar51 = vmulps_avx512vl(auVar50,auVar61);
        auVar51 = vfmsub231ps_avx512vl(auVar51,auVar60,auVar46);
        auVar65._4_4_ = auVar46._4_4_ * auVar59._4_4_;
        auVar65._0_4_ = auVar46._0_4_ * auVar59._0_4_;
        auVar65._8_4_ = auVar46._8_4_ * auVar59._8_4_;
        auVar65._12_4_ = auVar46._12_4_ * auVar59._12_4_;
        auVar65._16_4_ = auVar46._16_4_ * auVar59._16_4_;
        auVar65._20_4_ = auVar46._20_4_ * auVar59._20_4_;
        auVar65._24_4_ = auVar46._24_4_ * auVar59._24_4_;
        auVar65._28_4_ = auVar46._28_4_;
        auVar46 = vfmsub231ps_avx512vl(auVar65,auVar61,auVar49);
        auVar49 = vmulps_avx512vl(auVar49,auVar60);
        auVar49 = vfmsub231ps_avx512vl(auVar49,auVar59,auVar50);
        auVar49 = vmulps_avx512vl(auVar49,auVar78);
        auVar46 = vfmadd231ps_avx512vl(auVar49,auVar73,auVar46);
        auVar46 = vfmadd231ps_avx512vl(auVar46,auVar71,auVar51);
        auVar66._0_4_ = local_2540._0_4_ + local_2560._0_4_;
        auVar66._4_4_ = local_2540._4_4_ + local_2560._4_4_;
        auVar66._8_4_ = local_2540._8_4_ + local_2560._8_4_;
        auVar66._12_4_ = local_2540._12_4_ + local_2560._12_4_;
        auVar66._16_4_ = local_2540._16_4_ + local_2560._16_4_;
        auVar66._20_4_ = local_2540._20_4_ + local_2560._20_4_;
        auVar66._24_4_ = local_2540._24_4_ + local_2560._24_4_;
        auVar66._28_4_ = local_2540._28_4_ + local_2560._28_4_;
        local_2520 = vaddps_avx512vl(auVar46,auVar66);
        auVar50._8_4_ = 0x7fffffff;
        auVar50._0_8_ = 0x7fffffff7fffffff;
        auVar50._12_4_ = 0x7fffffff;
        auVar50._16_4_ = 0x7fffffff;
        auVar50._20_4_ = 0x7fffffff;
        auVar50._24_4_ = 0x7fffffff;
        auVar50._28_4_ = 0x7fffffff;
        vandps_avx512vl(local_2520,auVar50);
        auVar51._8_4_ = 0x34000000;
        auVar51._0_8_ = 0x3400000034000000;
        auVar51._12_4_ = 0x34000000;
        auVar51._16_4_ = 0x34000000;
        auVar51._20_4_ = 0x34000000;
        auVar51._24_4_ = 0x34000000;
        auVar51._28_4_ = 0x34000000;
        auVar49 = vmulps_avx512vl(local_2520,auVar51);
        auVar50 = vminps_avx512vl(local_2560,local_2540);
        auVar50 = vminps_avx512vl(auVar50,auVar46);
        auVar62._8_4_ = 0x80000000;
        auVar62._0_8_ = 0x8000000080000000;
        auVar62._12_4_ = 0x80000000;
        auVar62._16_4_ = 0x80000000;
        auVar62._20_4_ = 0x80000000;
        auVar62._24_4_ = 0x80000000;
        auVar62._28_4_ = 0x80000000;
        auVar51 = vxorps_avx512vl(auVar49,auVar62);
        uVar19 = vcmpps_avx512vl(auVar50,auVar51,5);
        auVar50 = vmaxps_avx512vl(local_2560,local_2540);
        auVar46 = vmaxps_avx512vl(auVar50,auVar46);
        uVar20 = vcmpps_avx512vl(auVar46,auVar49,2);
        bVar36 = (byte)uVar19 | (byte)uVar20;
        if (bVar36 != 0) {
          auVar46 = vmulps_avx512vl(auVar57,auVar45);
          auVar49 = vmulps_avx512vl(auVar54,auVar58);
          auVar50 = vmulps_avx512vl(auVar56,auVar55);
          auVar51 = vmulps_avx512vl(auVar60,auVar58);
          auVar52 = vmulps_avx512vl(auVar56,auVar61);
          auVar53 = vmulps_avx512vl(auVar59,auVar57);
          auVar62 = vfmsub213ps_avx512vl(auVar55,auVar58,auVar46);
          auVar45 = vfmsub213ps_avx512vl(auVar45,auVar56,auVar49);
          auVar64 = vfmsub213ps_avx512vl(auVar54,auVar57,auVar50);
          auVar63 = vfmsub213ps_avx512vl(auVar61,auVar57,auVar51);
          auVar65 = vfmsub213ps_avx512vl(auVar59,auVar58,auVar52);
          auVar54 = vfmsub213ps_avx512vl(auVar60,auVar56,auVar53);
          auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar46,auVar55);
          vandps_avx512vl(auVar51,auVar55);
          uVar37 = vcmpps_avx512vl(auVar55,auVar55,1);
          vandps_avx512vl(auVar49,auVar55);
          vandps_avx512vl(auVar52,auVar55);
          uVar21 = vcmpps_avx512vl(auVar55,auVar55,1);
          vandps_avx512vl(auVar50,auVar55);
          vandps_avx512vl(auVar53,auVar55);
          uVar22 = vcmpps_avx512vl(auVar55,auVar55,1);
          bVar18 = (bool)((byte)uVar37 & 1);
          local_2500._0_4_ = (float)((uint)bVar18 * auVar62._0_4_ | (uint)!bVar18 * auVar63._0_4_);
          bVar18 = (bool)((byte)(uVar37 >> 1) & 1);
          local_2500._4_4_ = (float)((uint)bVar18 * auVar62._4_4_ | (uint)!bVar18 * auVar63._4_4_);
          bVar18 = (bool)((byte)(uVar37 >> 2) & 1);
          local_2500._8_4_ = (float)((uint)bVar18 * auVar62._8_4_ | (uint)!bVar18 * auVar63._8_4_);
          bVar18 = (bool)((byte)(uVar37 >> 3) & 1);
          local_2500._12_4_ =
               (float)((uint)bVar18 * auVar62._12_4_ | (uint)!bVar18 * auVar63._12_4_);
          bVar18 = (bool)((byte)(uVar37 >> 4) & 1);
          local_2500._16_4_ =
               (float)((uint)bVar18 * auVar62._16_4_ | (uint)!bVar18 * auVar63._16_4_);
          bVar18 = (bool)((byte)(uVar37 >> 5) & 1);
          local_2500._20_4_ =
               (float)((uint)bVar18 * auVar62._20_4_ | (uint)!bVar18 * auVar63._20_4_);
          bVar18 = (bool)((byte)(uVar37 >> 6) & 1);
          local_2500._24_4_ =
               (float)((uint)bVar18 * auVar62._24_4_ | (uint)!bVar18 * auVar63._24_4_);
          bVar18 = SUB81(uVar37 >> 7,0);
          local_2500._28_4_ = (uint)bVar18 * auVar62._28_4_ | (uint)!bVar18 * auVar63._28_4_;
          bVar18 = (bool)((byte)uVar21 & 1);
          local_24e0._0_4_ = (float)((uint)bVar18 * auVar45._0_4_ | (uint)!bVar18 * auVar65._0_4_);
          bVar18 = (bool)((byte)(uVar21 >> 1) & 1);
          local_24e0._4_4_ = (float)((uint)bVar18 * auVar45._4_4_ | (uint)!bVar18 * auVar65._4_4_);
          bVar18 = (bool)((byte)(uVar21 >> 2) & 1);
          local_24e0._8_4_ = (float)((uint)bVar18 * auVar45._8_4_ | (uint)!bVar18 * auVar65._8_4_);
          bVar18 = (bool)((byte)(uVar21 >> 3) & 1);
          local_24e0._12_4_ =
               (float)((uint)bVar18 * auVar45._12_4_ | (uint)!bVar18 * auVar65._12_4_);
          bVar18 = (bool)((byte)(uVar21 >> 4) & 1);
          local_24e0._16_4_ =
               (float)((uint)bVar18 * auVar45._16_4_ | (uint)!bVar18 * auVar65._16_4_);
          bVar18 = (bool)((byte)(uVar21 >> 5) & 1);
          local_24e0._20_4_ =
               (float)((uint)bVar18 * auVar45._20_4_ | (uint)!bVar18 * auVar65._20_4_);
          bVar18 = (bool)((byte)(uVar21 >> 6) & 1);
          local_24e0._24_4_ =
               (float)((uint)bVar18 * auVar45._24_4_ | (uint)!bVar18 * auVar65._24_4_);
          bVar18 = SUB81(uVar21 >> 7,0);
          local_24e0._28_4_ = (uint)bVar18 * auVar45._28_4_ | (uint)!bVar18 * auVar65._28_4_;
          bVar18 = (bool)((byte)uVar22 & 1);
          local_24c0 = (float)((uint)bVar18 * auVar64._0_4_ | (uint)!bVar18 * auVar54._0_4_);
          bVar18 = (bool)((byte)(uVar22 >> 1) & 1);
          fStack_24bc = (float)((uint)bVar18 * auVar64._4_4_ | (uint)!bVar18 * auVar54._4_4_);
          bVar18 = (bool)((byte)(uVar22 >> 2) & 1);
          fStack_24b8 = (float)((uint)bVar18 * auVar64._8_4_ | (uint)!bVar18 * auVar54._8_4_);
          bVar18 = (bool)((byte)(uVar22 >> 3) & 1);
          fStack_24b4 = (float)((uint)bVar18 * auVar64._12_4_ | (uint)!bVar18 * auVar54._12_4_);
          bVar18 = (bool)((byte)(uVar22 >> 4) & 1);
          fStack_24b0 = (float)((uint)bVar18 * auVar64._16_4_ | (uint)!bVar18 * auVar54._16_4_);
          bVar18 = (bool)((byte)(uVar22 >> 5) & 1);
          fStack_24ac = (float)((uint)bVar18 * auVar64._20_4_ | (uint)!bVar18 * auVar54._20_4_);
          bVar18 = (bool)((byte)(uVar22 >> 6) & 1);
          fStack_24a8 = (float)((uint)bVar18 * auVar64._24_4_ | (uint)!bVar18 * auVar54._24_4_);
          bVar18 = SUB81(uVar22 >> 7,0);
          uStack_24a4 = (uint)bVar18 * auVar64._28_4_ | (uint)!bVar18 * auVar54._28_4_;
          auVar29._4_4_ = fVar6 * fStack_24bc;
          auVar29._0_4_ = fVar6 * local_24c0;
          auVar29._8_4_ = fVar6 * fStack_24b8;
          auVar29._12_4_ = fVar6 * fStack_24b4;
          auVar29._16_4_ = fVar6 * fStack_24b0;
          auVar29._20_4_ = fVar6 * fStack_24ac;
          auVar29._24_4_ = fVar6 * fStack_24a8;
          auVar29._28_4_ = fVar6;
          auVar12 = vfmadd213ps_fma(auVar73,local_24e0,auVar29);
          auVar12 = vfmadd213ps_fma(auVar71,local_2500,ZEXT1632(auVar12));
          auVar46 = ZEXT1632(CONCAT412(auVar12._12_4_ + auVar12._12_4_,
                                       CONCAT48(auVar12._8_4_ + auVar12._8_4_,
                                                CONCAT44(auVar12._4_4_ + auVar12._4_4_,
                                                         auVar12._0_4_ + auVar12._0_4_))));
          auVar74._0_4_ = auVar48._0_4_ * local_24c0;
          auVar74._4_4_ = auVar48._4_4_ * fStack_24bc;
          auVar74._8_4_ = auVar48._8_4_ * fStack_24b8;
          auVar74._12_4_ = auVar48._12_4_ * fStack_24b4;
          auVar74._16_4_ = auVar48._16_4_ * fStack_24b0;
          auVar74._20_4_ = auVar48._20_4_ * fStack_24ac;
          auVar74._24_4_ = auVar48._24_4_ * fStack_24a8;
          auVar74._28_4_ = 0;
          auVar12 = vfmadd213ps_fma(auVar47,local_24e0,auVar74);
          auVar24 = vfmadd213ps_fma(auVar67,local_2500,ZEXT1632(auVar12));
          auVar67 = vrcp14ps_avx512vl(auVar46);
          auVar45._8_4_ = 0x3f800000;
          auVar45._0_8_ = &DAT_3f8000003f800000;
          auVar45._12_4_ = 0x3f800000;
          auVar45._16_4_ = 0x3f800000;
          auVar45._20_4_ = 0x3f800000;
          auVar45._24_4_ = 0x3f800000;
          auVar45._28_4_ = 0x3f800000;
          auVar45 = vfnmadd213ps_avx512vl(auVar67,auVar46,auVar45);
          auVar12 = vfmadd132ps_fma(auVar45,auVar67,auVar67);
          local_2440._28_4_ = auVar48._28_4_;
          local_2440._0_28_ =
               ZEXT1628(CONCAT412((auVar24._12_4_ + auVar24._12_4_) * auVar12._12_4_,
                                  CONCAT48((auVar24._8_4_ + auVar24._8_4_) * auVar12._8_4_,
                                           CONCAT44((auVar24._4_4_ + auVar24._4_4_) * auVar12._4_4_,
                                                    (auVar24._0_4_ + auVar24._0_4_) * auVar12._0_4_)
                                          )));
          auVar69 = ZEXT3264(local_2440);
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar25._4_4_ = uVar9;
          auVar25._0_4_ = uVar9;
          auVar25._8_4_ = uVar9;
          auVar25._12_4_ = uVar9;
          auVar25._16_4_ = uVar9;
          auVar25._20_4_ = uVar9;
          auVar25._24_4_ = uVar9;
          auVar25._28_4_ = uVar9;
          uVar19 = vcmpps_avx512vl(local_2440,auVar25,0xd);
          uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar26._4_4_ = uVar9;
          auVar26._0_4_ = uVar9;
          auVar26._8_4_ = uVar9;
          auVar26._12_4_ = uVar9;
          auVar26._16_4_ = uVar9;
          auVar26._20_4_ = uVar9;
          auVar26._24_4_ = uVar9;
          auVar26._28_4_ = uVar9;
          uVar20 = vcmpps_avx512vl(local_2440,auVar26,2);
          bVar36 = (byte)uVar19 & (byte)uVar20 & bVar36;
          if (bVar36 != 0) {
            uVar37 = vcmpps_avx512vl(auVar46,_DAT_02020f00,4);
            uVar37 = bVar36 & uVar37;
            local_24a0 = (byte)uVar37;
            if (local_24a0 != 0) {
              local_23c0 = 0xf0;
              pSVar13 = context->scene;
              auVar27._8_4_ = 0x219392ef;
              auVar27._0_8_ = 0x219392ef219392ef;
              auVar27._12_4_ = 0x219392ef;
              auVar27._16_4_ = 0x219392ef;
              auVar27._20_4_ = 0x219392ef;
              auVar27._24_4_ = 0x219392ef;
              auVar27._28_4_ = 0x219392ef;
              uVar44 = vcmpps_avx512vl(local_2520,auVar27,5);
              auVar45 = vrcp14ps_avx512vl(local_2520);
              auVar72._8_4_ = 0x3f800000;
              auVar72._0_8_ = &DAT_3f8000003f800000;
              auVar72._12_4_ = 0x3f800000;
              auVar72._16_4_ = 0x3f800000;
              auVar72._20_4_ = 0x3f800000;
              auVar72._24_4_ = 0x3f800000;
              auVar72._28_4_ = 0x3f800000;
              auVar12 = vfnmadd213ps_fma(local_2520,auVar45,auVar72);
              auVar67 = vfmadd132ps_avx512vl(ZEXT1632(auVar12),auVar45,auVar45);
              fVar7 = (float)((uint)((byte)uVar44 & 1) * auVar67._0_4_);
              fVar6 = (float)((uint)((byte)(uVar44 >> 1) & 1) * auVar67._4_4_);
              fVar8 = (float)((uint)((byte)(uVar44 >> 2) & 1) * auVar67._8_4_);
              fVar1 = (float)((uint)((byte)(uVar44 >> 3) & 1) * auVar67._12_4_);
              fVar2 = (float)((uint)((byte)(uVar44 >> 4) & 1) * auVar67._16_4_);
              fVar3 = (float)((uint)((byte)(uVar44 >> 5) & 1) * auVar67._20_4_);
              fVar4 = (float)((uint)((byte)(uVar44 >> 6) & 1) * auVar67._24_4_);
              auVar30._4_4_ = fVar6 * local_2560._4_4_;
              auVar30._0_4_ = fVar7 * local_2560._0_4_;
              auVar30._8_4_ = fVar8 * local_2560._8_4_;
              auVar30._12_4_ = fVar1 * local_2560._12_4_;
              auVar30._16_4_ = fVar2 * local_2560._16_4_;
              auVar30._20_4_ = fVar3 * local_2560._20_4_;
              auVar30._24_4_ = fVar4 * local_2560._24_4_;
              auVar30._28_4_ = local_2560._28_4_;
              auVar67 = vminps_avx(auVar30,auVar72);
              auVar31._4_4_ = local_2540._4_4_ * fVar6;
              auVar31._0_4_ = local_2540._0_4_ * fVar7;
              auVar31._8_4_ = local_2540._8_4_ * fVar8;
              auVar31._12_4_ = local_2540._12_4_ * fVar1;
              auVar31._16_4_ = local_2540._16_4_ * fVar2;
              auVar31._20_4_ = local_2540._20_4_ * fVar3;
              auVar31._24_4_ = local_2540._24_4_ * fVar4;
              auVar31._28_4_ = auVar45._28_4_;
              auVar45 = vminps_avx(auVar31,auVar72);
              auVar46 = vsubps_avx(auVar72,auVar67);
              auVar47 = vsubps_avx(auVar72,auVar45);
              local_2460 = vblendps_avx(auVar45,auVar46,0xf0);
              local_2480 = vblendps_avx(auVar67,auVar47,0xf0);
              fVar6 = (float)DAT_02060940;
              fVar7 = DAT_02060940._4_4_;
              fVar8 = DAT_02060940._8_4_;
              fVar1 = DAT_02060940._12_4_;
              fVar2 = DAT_02060940._16_4_;
              fVar3 = DAT_02060940._20_4_;
              fVar4 = DAT_02060940._24_4_;
              local_2420[0] = local_2500._0_4_ * fVar6;
              local_2420[1] = local_2500._4_4_ * fVar7;
              local_2420[2] = local_2500._8_4_ * fVar8;
              local_2420[3] = local_2500._12_4_ * fVar1;
              fStack_2410 = local_2500._16_4_ * fVar2;
              fStack_240c = local_2500._20_4_ * fVar3;
              fStack_2408 = local_2500._24_4_ * fVar4;
              uStack_2404 = local_2500._28_4_;
              local_2400[0] = local_24e0._0_4_ * fVar6;
              local_2400[1] = local_24e0._4_4_ * fVar7;
              local_2400[2] = local_24e0._8_4_ * fVar8;
              local_2400[3] = local_24e0._12_4_ * fVar1;
              fStack_23f0 = local_24e0._16_4_ * fVar2;
              fStack_23ec = local_24e0._20_4_ * fVar3;
              fStack_23e8 = local_24e0._24_4_ * fVar4;
              uStack_23e4 = local_24e0._28_4_;
              local_23e0[0] = local_24c0 * fVar6;
              local_23e0[1] = fStack_24bc * fVar7;
              local_23e0[2] = fStack_24b8 * fVar8;
              local_23e0[3] = fStack_24b4 * fVar1;
              fStack_23d0 = fStack_24b0 * fVar2;
              fStack_23cc = fStack_24ac * fVar3;
              fStack_23c8 = fStack_24a8 * fVar4;
              uStack_23c4 = uStack_24a4;
              auVar75._8_4_ = 0x7f800000;
              auVar75._0_8_ = 0x7f8000007f800000;
              auVar75._12_4_ = 0x7f800000;
              auVar75._16_4_ = 0x7f800000;
              auVar75._20_4_ = 0x7f800000;
              auVar75._24_4_ = 0x7f800000;
              auVar75._28_4_ = 0x7f800000;
              auVar76 = ZEXT3264(auVar75);
              auVar67 = vblendmps_avx512vl(auVar75,local_2440);
              auVar68._0_4_ =
                   (uint)(local_24a0 & 1) * auVar67._0_4_ |
                   (uint)!(bool)(local_24a0 & 1) * (int)(local_24c0 * fVar6);
              bVar18 = (bool)((byte)(uVar37 >> 1) & 1);
              auVar68._4_4_ =
                   (uint)bVar18 * auVar67._4_4_ | (uint)!bVar18 * (int)(fStack_24bc * fVar7);
              bVar18 = (bool)((byte)(uVar37 >> 2) & 1);
              auVar68._8_4_ =
                   (uint)bVar18 * auVar67._8_4_ | (uint)!bVar18 * (int)(fStack_24b8 * fVar8);
              bVar18 = (bool)((byte)(uVar37 >> 3) & 1);
              auVar68._12_4_ =
                   (uint)bVar18 * auVar67._12_4_ | (uint)!bVar18 * (int)(fStack_24b4 * fVar1);
              bVar18 = (bool)((byte)(uVar37 >> 4) & 1);
              auVar68._16_4_ =
                   (uint)bVar18 * auVar67._16_4_ | (uint)!bVar18 * (int)(fStack_24b0 * fVar2);
              bVar18 = (bool)((byte)(uVar37 >> 5) & 1);
              auVar68._20_4_ =
                   (uint)bVar18 * auVar67._20_4_ | (uint)!bVar18 * (int)(fStack_24ac * fVar3);
              bVar18 = (bool)((byte)(uVar37 >> 6) & 1);
              auVar68._24_4_ =
                   (uint)bVar18 * auVar67._24_4_ | (uint)!bVar18 * (int)(fStack_24a8 * fVar4);
              bVar18 = SUB81(uVar37 >> 7,0);
              auVar68._28_4_ = (uint)bVar18 * auVar67._28_4_ | !bVar18 * uStack_24a4;
              auVar67 = vshufps_avx(auVar68,auVar68,0xb1);
              auVar67 = vminps_avx(auVar68,auVar67);
              auVar45 = vshufpd_avx(auVar67,auVar67,5);
              auVar67 = vminps_avx(auVar67,auVar45);
              auVar45 = vpermpd_avx2(auVar67,0x4e);
              auVar67 = vminps_avx(auVar67,auVar45);
              uVar19 = vcmpps_avx512vl(auVar68,auVar67,0);
              bVar36 = (byte)uVar19 & local_24a0;
              do {
                uVar39 = (uint)uVar37;
                if (bVar36 != 0) {
                  uVar39 = (uint)bVar36;
                }
                uVar23 = 0;
                for (; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x80000000) {
                  uVar23 = uVar23 + 1;
                }
                uVar40 = uVar23 & 0xff;
                uVar39 = *(uint *)((long)&local_2580 + (ulong)uVar40 * 4);
                pGVar14 = (pSVar13->geometries).items[uVar39].ptr;
                auVar67 = auVar68;
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar37 = (ulong)(byte)(~(byte)(1 << (uVar23 & 0x1f)) & (byte)uVar37);
LAB_008520d4:
                  bVar18 = true;
                }
                else {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    uVar44 = (ulong)(uVar40 * 4);
                    uVar9 = *(undefined4 *)(local_2480 + uVar44);
                    local_2680._4_4_ = uVar9;
                    local_2680._0_4_ = uVar9;
                    local_2680._8_4_ = uVar9;
                    local_2680._12_4_ = uVar9;
                    local_2670 = *(undefined4 *)(local_2460 + uVar44);
                    local_2650 = vpbroadcastd_avx512vl();
                    uVar9 = *(undefined4 *)((long)&local_26e0 + uVar44);
                    local_2660._4_4_ = uVar9;
                    local_2660._0_4_ = uVar9;
                    local_2660._8_4_ = uVar9;
                    local_2660._12_4_ = uVar9;
                    uVar9 = *(undefined4 *)((long)local_2420 + uVar44);
                    uVar11 = *(undefined4 *)((long)local_2400 + uVar44);
                    local_26a0._4_4_ = uVar11;
                    local_26a0._0_4_ = uVar11;
                    local_26a0._8_4_ = uVar11;
                    local_26a0._12_4_ = uVar11;
                    uVar11 = *(undefined4 *)((long)local_23e0 + uVar44);
                    local_2690._4_4_ = uVar11;
                    local_2690._0_4_ = uVar11;
                    local_2690._8_4_ = uVar11;
                    local_2690._12_4_ = uVar11;
                    local_26b0[0] = (RTCHitN)(char)uVar9;
                    local_26b0[1] = (RTCHitN)(char)((uint)uVar9 >> 8);
                    local_26b0[2] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                    local_26b0[3] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                    local_26b0[4] = (RTCHitN)(char)uVar9;
                    local_26b0[5] = (RTCHitN)(char)((uint)uVar9 >> 8);
                    local_26b0[6] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                    local_26b0[7] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                    local_26b0[8] = (RTCHitN)(char)uVar9;
                    local_26b0[9] = (RTCHitN)(char)((uint)uVar9 >> 8);
                    local_26b0[10] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                    local_26b0[0xb] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                    local_26b0[0xc] = (RTCHitN)(char)uVar9;
                    local_26b0[0xd] = (RTCHitN)(char)((uint)uVar9 >> 8);
                    local_26b0[0xe] = (RTCHitN)(char)((uint)uVar9 >> 0x10);
                    local_26b0[0xf] = (RTCHitN)(char)((uint)uVar9 >> 0x18);
                    uStack_266c = local_2670;
                    uStack_2668 = local_2670;
                    uStack_2664 = local_2670;
                    vpcmpeqd_avx2(ZEXT1632(local_2680),ZEXT1632(local_2680));
                    uStack_263c = context->user->instID[0];
                    local_2640 = uStack_263c;
                    uStack_2638 = uStack_263c;
                    uStack_2634 = uStack_263c;
                    uStack_2630 = context->user->instPrimID[0];
                    uStack_262c = uStack_2630;
                    uStack_2628 = uStack_2630;
                    uStack_2624 = uStack_2630;
                    uVar10 = *(uint *)(ray + k * 4 + 0x80);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar44);
                    local_2870 = local_2710._0_8_;
                    uStack_2868 = local_2710._8_8_;
                    local_2810.valid = (int *)&local_2870;
                    local_2810.geometryUserPtr = pGVar14->userPtr;
                    local_2810.context = context->user;
                    local_2810.hit = local_26b0;
                    local_2810.N = 4;
                    local_2700 = auVar69._0_32_;
                    local_2810.ray = (RTCRayN *)ray;
                    if (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      local_2858 = puVar41;
                      (*pGVar14->intersectionFilterN)(&local_2810);
                      auVar69 = ZEXT3264(local_2700);
                      auVar76 = ZEXT3264(CONCAT428(0x7f800000,
                                                   CONCAT424(0x7f800000,
                                                             CONCAT420(0x7f800000,
                                                                       CONCAT416(0x7f800000,
                                                                                 CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                      auVar89 = ZEXT3264(local_27e0);
                      auVar88 = ZEXT3264(local_27c0);
                      auVar87 = ZEXT3264(local_27a0);
                      auVar86 = ZEXT3264(local_2780);
                      auVar85 = ZEXT3264(local_2760);
                      auVar84 = ZEXT3264(local_2740);
                      puVar41 = local_2858;
                    }
                    auVar12._8_8_ = uStack_2868;
                    auVar12._0_8_ = local_2870;
                    uVar44 = vptestmd_avx512vl(auVar12,auVar12);
                    if ((uVar44 & 0xf) == 0) {
LAB_0085240d:
                      auVar67 = ZEXT432(uVar10);
                      *(uint *)(ray + k * 4 + 0x80) = uVar10;
                    }
                    else {
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var15)(&local_2810);
                        auVar69 = ZEXT3264(local_2700);
                        auVar76 = ZEXT3264(CONCAT428(0x7f800000,
                                                     CONCAT424(0x7f800000,
                                                               CONCAT420(0x7f800000,
                                                                         CONCAT416(0x7f800000,
                                                                                   CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                        auVar89 = ZEXT3264(local_27e0);
                        auVar88 = ZEXT3264(local_27c0);
                        auVar87 = ZEXT3264(local_27a0);
                        auVar86 = ZEXT3264(local_2780);
                        auVar85 = ZEXT3264(local_2760);
                        auVar84 = ZEXT3264(local_2740);
                      }
                      auVar24._8_8_ = uStack_2868;
                      auVar24._0_8_ = local_2870;
                      uVar44 = vptestmd_avx512vl(auVar24,auVar24);
                      uVar44 = uVar44 & 0xf;
                      bVar36 = (byte)uVar44;
                      if (bVar36 == 0) goto LAB_0085240d;
                      iVar34 = *(int *)(local_2810.hit + 4);
                      iVar33 = *(int *)(local_2810.hit + 8);
                      iVar32 = *(int *)(local_2810.hit + 0xc);
                      bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar16 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar17 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0xc0) =
                           (uint)(bVar36 & 1) * *(int *)local_2810.hit |
                           (uint)!(bool)(bVar36 & 1) * *(int *)(local_2810.ray + 0xc0);
                      *(uint *)(local_2810.ray + 0xc4) =
                           (uint)bVar18 * iVar34 | (uint)!bVar18 * *(int *)(local_2810.ray + 0xc4);
                      *(uint *)(local_2810.ray + 200) =
                           (uint)bVar16 * iVar33 | (uint)!bVar16 * *(int *)(local_2810.ray + 200);
                      *(uint *)(local_2810.ray + 0xcc) =
                           (uint)bVar17 * iVar32 | (uint)!bVar17 * *(int *)(local_2810.ray + 0xcc);
                      iVar34 = *(int *)(local_2810.hit + 0x14);
                      iVar33 = *(int *)(local_2810.hit + 0x18);
                      iVar32 = *(int *)(local_2810.hit + 0x1c);
                      bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar16 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar17 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0xd0) =
                           (uint)(bVar36 & 1) * *(int *)(local_2810.hit + 0x10) |
                           (uint)!(bool)(bVar36 & 1) * *(int *)(local_2810.ray + 0xd0);
                      *(uint *)(local_2810.ray + 0xd4) =
                           (uint)bVar18 * iVar34 | (uint)!bVar18 * *(int *)(local_2810.ray + 0xd4);
                      *(uint *)(local_2810.ray + 0xd8) =
                           (uint)bVar16 * iVar33 | (uint)!bVar16 * *(int *)(local_2810.ray + 0xd8);
                      *(uint *)(local_2810.ray + 0xdc) =
                           (uint)bVar17 * iVar32 | (uint)!bVar17 * *(int *)(local_2810.ray + 0xdc);
                      iVar34 = *(int *)(local_2810.hit + 0x24);
                      iVar33 = *(int *)(local_2810.hit + 0x28);
                      iVar32 = *(int *)(local_2810.hit + 0x2c);
                      bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar16 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar17 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0xe0) =
                           (uint)(bVar36 & 1) * *(int *)(local_2810.hit + 0x20) |
                           (uint)!(bool)(bVar36 & 1) * *(int *)(local_2810.ray + 0xe0);
                      *(uint *)(local_2810.ray + 0xe4) =
                           (uint)bVar18 * iVar34 | (uint)!bVar18 * *(int *)(local_2810.ray + 0xe4);
                      *(uint *)(local_2810.ray + 0xe8) =
                           (uint)bVar16 * iVar33 | (uint)!bVar16 * *(int *)(local_2810.ray + 0xe8);
                      *(uint *)(local_2810.ray + 0xec) =
                           (uint)bVar17 * iVar32 | (uint)!bVar17 * *(int *)(local_2810.ray + 0xec);
                      iVar34 = *(int *)(local_2810.hit + 0x34);
                      iVar33 = *(int *)(local_2810.hit + 0x38);
                      iVar32 = *(int *)(local_2810.hit + 0x3c);
                      bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar16 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar17 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0xf0) =
                           (uint)(bVar36 & 1) * *(int *)(local_2810.hit + 0x30) |
                           (uint)!(bool)(bVar36 & 1) * *(int *)(local_2810.ray + 0xf0);
                      *(uint *)(local_2810.ray + 0xf4) =
                           (uint)bVar18 * iVar34 | (uint)!bVar18 * *(int *)(local_2810.ray + 0xf4);
                      *(uint *)(local_2810.ray + 0xf8) =
                           (uint)bVar16 * iVar33 | (uint)!bVar16 * *(int *)(local_2810.ray + 0xf8);
                      *(uint *)(local_2810.ray + 0xfc) =
                           (uint)bVar17 * iVar32 | (uint)!bVar17 * *(int *)(local_2810.ray + 0xfc);
                      iVar34 = *(int *)(local_2810.hit + 0x44);
                      iVar33 = *(int *)(local_2810.hit + 0x48);
                      iVar32 = *(int *)(local_2810.hit + 0x4c);
                      bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                      bVar16 = (bool)((byte)(uVar44 >> 2) & 1);
                      bVar17 = SUB81(uVar44 >> 3,0);
                      *(uint *)(local_2810.ray + 0x100) =
                           (uint)(bVar36 & 1) * *(int *)(local_2810.hit + 0x40) |
                           (uint)!(bool)(bVar36 & 1) * *(int *)(local_2810.ray + 0x100);
                      *(uint *)(local_2810.ray + 0x104) =
                           (uint)bVar18 * iVar34 | (uint)!bVar18 * *(int *)(local_2810.ray + 0x104);
                      *(uint *)(local_2810.ray + 0x108) =
                           (uint)bVar16 * iVar33 | (uint)!bVar16 * *(int *)(local_2810.ray + 0x108);
                      *(uint *)(local_2810.ray + 0x10c) =
                           (uint)bVar17 * iVar32 | (uint)!bVar17 * *(int *)(local_2810.ray + 0x10c);
                      auVar12 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x50));
                      *(undefined1 (*) [16])(local_2810.ray + 0x110) = auVar12;
                      auVar12 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x60));
                      *(undefined1 (*) [16])(local_2810.ray + 0x120) = auVar12;
                      auVar12 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x70));
                      *(undefined1 (*) [16])(local_2810.ray + 0x130) = auVar12;
                      auVar67 = ZEXT1632(*(undefined1 (*) [16])(local_2810.hit + 0x80));
                      auVar12 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_2810.hit + 0x80));
                      *(undefined1 (*) [16])(local_2810.ray + 0x140) = auVar12;
                    }
                    uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
                    auVar28._4_4_ = uVar9;
                    auVar28._0_4_ = uVar9;
                    auVar28._8_4_ = uVar9;
                    auVar28._12_4_ = uVar9;
                    auVar28._16_4_ = uVar9;
                    auVar28._20_4_ = uVar9;
                    auVar28._24_4_ = uVar9;
                    auVar28._28_4_ = uVar9;
                    uVar44 = vcmpps_avx512vl(auVar69._0_32_,auVar28,2);
                    uVar37 = (byte)(~(byte)(1 << (uVar23 & 0x1f)) & (byte)uVar37) & uVar44;
                    goto LAB_008520d4;
                  }
                  bVar18 = false;
                }
                uVar44 = local_2850;
                unaff_RBX = local_2848;
                if (!bVar18) {
                  uVar37 = (ulong)(uVar40 << 2);
                  uVar9 = *(undefined4 *)(local_2480 + uVar37);
                  uVar11 = *(undefined4 *)(local_2460 + uVar37);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar37);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_2420 + uVar37);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_2400 + uVar37);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)local_23e0 + uVar37);
                  *(undefined4 *)(ray + k * 4 + 0xf0) = uVar9;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar11;
                  *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_26e0 + uVar37)
                  ;
                  *(uint *)(ray + k * 4 + 0x120) = uVar39;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  break;
                }
                bVar36 = (byte)uVar37;
                if (bVar36 == 0) break;
                auVar45 = vblendmps_avx512vl(auVar76._0_32_,auVar69._0_32_);
                auVar68._0_4_ =
                     (uint)(bVar36 & 1) * auVar45._0_4_ | (uint)!(bool)(bVar36 & 1) * auVar67._0_4_;
                bVar18 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar68._4_4_ = (uint)bVar18 * auVar45._4_4_ | (uint)!bVar18 * auVar67._4_4_;
                bVar18 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar68._8_4_ = (uint)bVar18 * auVar45._8_4_ | (uint)!bVar18 * auVar67._8_4_;
                bVar18 = (bool)((byte)(uVar37 >> 3) & 1);
                auVar68._12_4_ = (uint)bVar18 * auVar45._12_4_ | (uint)!bVar18 * auVar67._12_4_;
                bVar18 = (bool)((byte)(uVar37 >> 4) & 1);
                auVar68._16_4_ = (uint)bVar18 * auVar45._16_4_ | (uint)!bVar18 * auVar67._16_4_;
                bVar18 = (bool)((byte)(uVar37 >> 5) & 1);
                auVar68._20_4_ = (uint)bVar18 * auVar45._20_4_ | (uint)!bVar18 * auVar67._20_4_;
                bVar18 = (bool)((byte)(uVar37 >> 6) & 1);
                auVar68._24_4_ = (uint)bVar18 * auVar45._24_4_ | (uint)!bVar18 * auVar67._24_4_;
                bVar18 = SUB81(uVar37 >> 7,0);
                auVar68._28_4_ = (uint)bVar18 * auVar45._28_4_ | (uint)!bVar18 * auVar67._28_4_;
                auVar67 = vshufps_avx(auVar68,auVar68,0xb1);
                auVar67 = vminps_avx(auVar68,auVar67);
                auVar45 = vshufpd_avx(auVar67,auVar67,5);
                auVar67 = vminps_avx(auVar67,auVar45);
                auVar45 = vpermpd_avx2(auVar67,0x4e);
                auVar67 = vminps_avx(auVar67,auVar45);
                uVar19 = vcmpps_avx512vl(auVar68,auVar67,0);
                bVar36 = (byte)uVar19 & bVar36;
              } while( true );
            }
          }
        }
        local_2818 = local_2818 + 1;
      } while (local_2818 != local_2840);
    }
    uVar9 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar69 = ZEXT3264(CONCAT428(uVar9,CONCAT424(uVar9,CONCAT420(uVar9,CONCAT416(uVar9,CONCAT412(
                                                  uVar9,CONCAT48(uVar9,CONCAT44(uVar9,uVar9))))))));
    auVar76 = ZEXT3264(local_25c0);
    auVar77 = ZEXT3264(local_25e0);
    auVar79 = ZEXT3264(local_2600);
    auVar80 = ZEXT3264(local_2620);
    auVar67 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar81 = ZEXT3264(auVar67);
    auVar82 = ZEXT3264(CONCAT428(0xfffffff8,
                                 CONCAT424(0xfffffff8,
                                           CONCAT420(0xfffffff8,
                                                     CONCAT416(0xfffffff8,
                                                               CONCAT412(0xfffffff8,
                                                                         CONCAT48(0xfffffff8,
                                                                                  0xfffffff8fffffff8
                                                                                 )))))));
    in_ZMM15 = ZEXT3264(local_25a0);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }